

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::GetRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  FieldOptions_CType FVar4;
  int iVar5;
  Descriptor *pDVar6;
  ExtensionSet *this_00;
  RepeatedPtrFieldBase *pRVar7;
  CppType in_ECX;
  FieldDescriptor *in_RDX;
  FieldDescriptor *in_RDI;
  FieldOptions_CType in_R8D;
  Descriptor *in_R9;
  ExtensionSet *unaff_retaddr;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  Message *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  CppType in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar8;
  FieldDescriptor *in_stack_ffffffffffffff98;
  Descriptor *in_stack_ffffffffffffffa0;
  undefined8 in_stack_fffffffffffffff8;
  
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              ((Descriptor *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x41bab5);
  if (CVar3 != in_ECX) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
  }
  if (-1 < (int)in_R8D) {
    FieldDescriptor::options(in_RDX);
    FVar4 = FieldOptions::ctype((FieldOptions *)0x41bb04);
    bVar8 = 0;
    if (FVar4 != in_R8D) {
      internal::LogMessage::LogMessage
                ((LogMessage *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec);
      bVar8 = 1;
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      internal::LogFinisher::operator=
                ((LogFinisher *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    if ((bVar8 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)0x41bba3);
    }
  }
  if ((in_R9 != (Descriptor *)0x0) &&
     (pDVar6 = FieldDescriptor::message_type
                         ((FieldDescriptor *)
                          CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0)),
     pDVar6 != in_R9)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    internal::LogMessage::~LogMessage((LogMessage *)0x41bc82);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    this_00 = MutableExtensionSet((Reflection *)
                                  CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                                  (Message *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    iVar5 = FieldDescriptor::number(in_RDX);
    FieldDescriptor::type((FieldDescriptor *)CONCAT44(iVar5,in_stack_ffffffffffffff00));
    FieldDescriptor::is_packed((FieldDescriptor *)this_00);
    pRVar7 = (RepeatedPtrFieldBase *)
             internal::ExtensionSet::MutableRawRepeatedField
                       (unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                        (FieldType)((ulong)in_stack_fffffffffffffff8 >> 0x18),
                        SUB81((ulong)in_stack_fffffffffffffff8 >> 0x10,0),in_RDI);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x41bd43);
    if (bVar1) {
      GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                ((Reflection *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8,
                 (FieldDescriptor *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      pRVar7 = internal::MapFieldBase::GetRepeatedField
                         ((MapFieldBase *)
                          CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    }
    else {
      pRVar7 = (RepeatedPtrFieldBase *)
               GetRawNonOneof<char>
                         ((Reflection *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8,
                          (FieldDescriptor *)
                          CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    }
  }
  return pRVar7;
}

Assistant:

const void* Reflection::GetRawRepeatedField(const Message& message,
                                            const FieldDescriptor* field,
                                            FieldDescriptor::CppType cpptype,
                                            int ctype,
                                            const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("GetRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_, field, "GetRawRepeatedField",
                                   cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    // Should use extension_set::GetRawRepeatedField. However, the required
    // parameter "default repeated value" is not very easy to get here.
    // Map is not supported in extensions, it is acceptable to use
    // extension_set::MutableRawRepeatedField which does not change the message.
    return MutableExtensionSet(const_cast<Message*>(&message))
        ->MutableRawRepeatedField(field->number(), field->type(),
                                  field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return &(GetRawNonOneof<MapFieldBase>(message, field).GetRepeatedField());
    }
    return &GetRawNonOneof<char>(message, field);
  }
}